

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_states.hpp
# Opt level: O0

bool __thiscall
afsm::detail::
state_machine_base_impl<vending::vending_def,afsm::none,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>
::is_in_substate<vending::vending_def::on::serving::idle,vending::vending_def::on>
          (state_machine_base_impl<vending::vending_def,afsm::none,afsm::state_machine<vending::vending_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>
           *this,type_tuple<vending::vending_def::on> *param_1)

{
  bool bVar1;
  type *this_00;
  size_type extraout_RDX;
  size_type extraout_RDX_00;
  size_type sVar2;
  initializer_list<bool> args;
  meta local_2a;
  meta local_29;
  meta *local_28;
  undefined8 local_20;
  type_tuple<vending::vending_def::on> *local_18;
  type_tuple<vending::vending_def::on> *param_1_local;
  state_machine_base_impl<vending::vending_def,_afsm::none,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
  *this_local;
  
  local_18 = param_1;
  param_1_local = (type_tuple<vending::vending_def::on> *)this;
  bVar1 = state_machine_base_impl<vending::vending_def,_afsm::none,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
          ::is_in_state<vending::vending_def::on>
                    ((state_machine_base_impl<vending::vending_def,_afsm::none,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                      *)this);
  local_2a = (meta)0x0;
  sVar2 = extraout_RDX;
  if (bVar1) {
    this_00 = state_machine_base_impl<vending::vending_def,_afsm::none,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
              ::get_state<vending::vending_def::on>
                        ((state_machine_base_impl<vending::vending_def,_afsm::none,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>
                          *)this);
    local_2a = (meta)state_machine_base_impl<vending::vending_def::on,_afsm::none,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>
                     ::is_in_state<vending::vending_def::on::serving::idle>
                               ((state_machine_base_impl<vending::vending_def::on,_afsm::none,_afsm::inner_state_machine<vending::vending_def::on,_afsm::state_machine<vending::vending_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>
                                 *)this_00);
    sVar2 = extraout_RDX_00;
  }
  local_29 = local_2a;
  local_28 = &local_29;
  local_20 = 1;
  args._M_len = sVar2;
  args._M_array = (iterator)0x1;
  bVar1 = psst::meta::any_of(local_28,args);
  return bVar1;
}

Assistant:

bool
    is_in_substate( ::psst::meta::type_tuple<ImmediateSubStates...> const& ) const
    {
        return ::psst::meta::any_of({
                (this->template is_in_state<ImmediateSubStates>() &&
                 this->template get_state< ImmediateSubStates >().
                            template is_in_state<StateDef>()) ...
        });
    }